

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grid_geometry_device.cpp
# Opt level: O0

uint embree::addGroundPlane(RTCScene scene_i)

{
  uint uVar1;
  undefined8 uVar2;
  undefined4 *puVar3;
  undefined8 in_RDI;
  uint geomID;
  Triangle *triangles;
  Vertex *vertices;
  RTCGeometry geom;
  
  uVar2 = rtcNewGeometry(g_device,0);
  puVar3 = (undefined4 *)rtcSetNewGeometryBuffer(uVar2,1,0,0x9003,0x10,4);
  *puVar3 = 0xc1200000;
  puVar3[1] = 0xc0000000;
  puVar3[2] = 0xc1200000;
  puVar3[4] = 0xc1200000;
  puVar3[5] = 0xc0000000;
  puVar3[6] = 0x41200000;
  puVar3[8] = 0x41200000;
  puVar3[9] = 0xc0000000;
  puVar3[10] = 0xc1200000;
  puVar3[0xc] = 0x41200000;
  puVar3[0xd] = 0xc0000000;
  puVar3[0xe] = 0x41200000;
  puVar3 = (undefined4 *)rtcSetNewGeometryBuffer(uVar2,0,0,0x5003,0xc,2);
  *puVar3 = 0;
  puVar3[1] = 1;
  puVar3[2] = 2;
  puVar3[3] = 1;
  puVar3[4] = 3;
  puVar3[5] = 2;
  rtcCommitGeometry(uVar2);
  uVar1 = rtcAttachGeometry(in_RDI,uVar2);
  rtcReleaseGeometry(uVar2);
  return uVar1;
}

Assistant:

unsigned int addGroundPlane (RTCScene scene_i)
{
  /* create a triangulated plane with 2 triangles and 4 vertices */
  RTCGeometry geom = rtcNewGeometry (g_device, RTC_GEOMETRY_TYPE_TRIANGLE);

  /* set vertices */
  Vertex* vertices = (Vertex*) rtcSetNewGeometryBuffer(geom,RTC_BUFFER_TYPE_VERTEX,0,RTC_FORMAT_FLOAT3,sizeof(Vertex),4);
  vertices[0].x = -10; vertices[0].y = -2; vertices[0].z = -10;
  vertices[1].x = -10; vertices[1].y = -2; vertices[1].z = +10;
  vertices[2].x = +10; vertices[2].y = -2; vertices[2].z = -10;
  vertices[3].x = +10; vertices[3].y = -2; vertices[3].z = +10;

  /* set triangles */
  Triangle* triangles = (Triangle*) rtcSetNewGeometryBuffer(geom,RTC_BUFFER_TYPE_INDEX,0,RTC_FORMAT_UINT3,sizeof(Triangle),2);
  triangles[0].v0 = 0; triangles[0].v1 = 1; triangles[0].v2 = 2;
  triangles[1].v0 = 1; triangles[1].v1 = 3; triangles[1].v2 = 2;

  rtcCommitGeometry(geom);
  unsigned int geomID = rtcAttachGeometry(scene_i,geom);
  rtcReleaseGeometry(geom);
  return geomID;
}